

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

Vec_Vec_t * Gia_ManLevelize(Gia_Man_t *p)

{
  int iVar1;
  int Level;
  Vec_Vec_t *p_00;
  Gia_Obj_t *pObj;
  int v;
  
  iVar1 = Gia_ManLevelNum(p);
  p_00 = Vec_VecStart(iVar1 + 1);
  v = 0;
  while( true ) {
    if (p->nObjs <= v) {
      return p_00;
    }
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      Level = Gia_ObjLevel(p,pObj);
      if (iVar1 < Level) {
        __assert_fail("Level <= nLevels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDfs.c"
                      ,0x19d,"Vec_Vec_t *Gia_ManLevelize(Gia_Man_t *)");
      }
      Vec_VecPush(p_00,Level,pObj);
    }
    v = v + 1;
  }
  return p_00;
}

Assistant:

Vec_Vec_t * Gia_ManLevelize( Gia_Man_t * p )
{ 
    Gia_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, Level, i;
    nLevels = Gia_ManLevelNum( p );
    vLevels = Vec_VecStart( nLevels + 1 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Level = Gia_ObjLevel( p, pObj );
        assert( Level <= nLevels );
        Vec_VecPush( vLevels, Level, pObj );
    }
    return vLevels;
}